

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::TParseContext::declareVariable
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TPublicType *publicType,
          TArraySizes *arraySizes,TIntermTyped *initializer)

{
  bool bVar1;
  TBasicType TVar2;
  int iVar3;
  TLayoutDepth TVar4;
  TLayoutStencil TVar5;
  TArraySizes *pTVar6;
  char *pcVar7;
  TQualifier *pTVar8;
  TString *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TVariable *variable;
  TIntermNode *initNode;
  TVariable *pTStack_180;
  bool remapped;
  TSymbol *symbol;
  TType perVertexType;
  undefined1 local_d8 [8];
  TType type;
  TIntermTyped *initializer_local;
  TArraySizes *arraySizes_local;
  TPublicType *publicType_local;
  TString *identifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  type.spirvType = (TSpirvType *)initializer;
  TType::TType((TType *)local_d8,publicType);
  TType::transferArraySizes((TType *)local_d8,arraySizes);
  TType::copyArrayInnerSizes((TType *)local_d8,publicType->arraySizes);
  pTVar6 = TType::getArraySizes((TType *)local_d8);
  arrayOfArrayVersionCheck(this,loc,pTVar6);
  if (type.spirvType != (TSpirvType *)0x0) {
    TVar2 = TType::getBasicType((TType *)local_d8);
    if (TVar2 == EbtRayQuery) {
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (identifier);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "ray queries can only be initialized by using the rayQueryInitializeEXT intrinsic:"
                 ,"=",pcVar7);
    }
    else {
      TVar2 = TType::getBasicType((TType *)local_d8);
      if (TVar2 == EbtHitObjectNV) {
        pcVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (identifier);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"hit objects cannot be initialized using initializers","=",pcVar7);
      }
    }
  }
  bVar1 = TType::isCoopMatKHR((TType *)local_d8);
  if (bVar1) {
    TIntermediate::setUseVulkanMemoryModel
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    TIntermediate::setUseStorageBuffer
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if (((publicType->typeParameters == (TTypeParameters *)0x0) ||
        (publicType->typeParameters->arraySizes == (TArraySizes *)0x0)) ||
       (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), iVar3 != 4)) {
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (identifier);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"unexpected number type parameters",pcVar7,"");
    }
    if (((publicType->typeParameters != (TTypeParameters *)0x0) &&
        (bVar1 = isTypeFloat(publicType->typeParameters->basicType), !bVar1)) &&
       ((bVar1 = isTypeInt(publicType->typeParameters->basicType), !bVar1 &&
        (publicType->typeParameters->basicType != EbtSpirvType)))) {
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (identifier);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "expected 8, 16, 32, or 64 bit signed or unsigned integer or 16, 32, or 64 bit float type"
                 ,pcVar7,"");
    }
  }
  else {
    bVar1 = TType::isCoopMatNV((TType *)local_d8);
    if (bVar1) {
      TIntermediate::setUseVulkanMemoryModel
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      TIntermediate::setUseStorageBuffer
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      if (((publicType->typeParameters == (TTypeParameters *)0x0) ||
          (publicType->typeParameters->arraySizes == (TArraySizes *)0x0)) ||
         (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), iVar3 != 4)) {
        pcVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (identifier);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"expected four type parameters",pcVar7,"");
      }
      else {
        bVar1 = isTypeFloat(publicType->basicType);
        if ((((bVar1) &&
             (iVar3 = TArraySizes::getDimSize(publicType->typeParameters->arraySizes,0),
             iVar3 != 0x10)) &&
            (iVar3 = TArraySizes::getDimSize(publicType->typeParameters->arraySizes,0),
            iVar3 != 0x20)) &&
           (iVar3 = TArraySizes::getDimSize(publicType->typeParameters->arraySizes,0), iVar3 != 0x40
           )) {
          pcVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (identifier);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"expected 16, 32, or 64 bits for first type parameter",pcVar7,"");
        }
        bVar1 = isTypeInt(publicType->basicType);
        if (((bVar1) &&
            (iVar3 = TArraySizes::getDimSize(publicType->typeParameters->arraySizes,0), iVar3 != 8))
           && ((iVar3 = TArraySizes::getDimSize(publicType->typeParameters->arraySizes,0),
               iVar3 != 0x10 &&
               (iVar3 = TArraySizes::getDimSize(publicType->typeParameters->arraySizes,0),
               iVar3 != 0x20)))) {
          pcVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (identifier);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"expected 8, 16, or 32 bits for first type parameter",pcVar7,"");
        }
      }
    }
    else {
      bVar1 = TType::isTensorLayoutNV((TType *)local_d8);
      if (bVar1) {
        if ((publicType->typeParameters == (TTypeParameters *)0x0) ||
           (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), 2 < iVar3)) {
          pcVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (identifier);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"expected 1-2 type parameters",pcVar7,"");
        }
      }
      else {
        bVar1 = TType::isTensorViewNV((TType *)local_d8);
        if (bVar1) {
          if ((publicType->typeParameters == (TTypeParameters *)0x0) ||
             (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), 7 < iVar3)) {
            pcVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(identifier);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"expected 1-7 type parameters",pcVar7,"");
          }
        }
        else {
          bVar1 = TType::isCoopVecNV((TType *)local_d8);
          if (bVar1) {
            TIntermediate::setUseVulkanMemoryModel
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
            TIntermediate::setUseStorageBuffer
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
            if (((publicType->typeParameters == (TTypeParameters *)0x0) ||
                (publicType->typeParameters->arraySizes == (TArraySizes *)0x0)) ||
               (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), iVar3 != 1)
               ) {
              pcVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       c_str(identifier);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"expected two type parameters",pcVar7,"");
            }
            else {
              iVar3 = TArraySizes::getDimSize(publicType->typeParameters->arraySizes,0);
              if (iVar3 < 1) {
                pcVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::c_str(identifier);
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"expected positive number of components",pcVar7,"");
              }
            }
          }
          else if ((publicType->typeParameters != (TTypeParameters *)0x0) &&
                  (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes),
                  iVar3 != 0)) {
            pcVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(identifier);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"unexpected type parameters",pcVar7,"");
          }
        }
      }
    }
  }
  TVar2 = TType::getBasicType((TType *)local_d8);
  bVar1 = voidErrorCheck(this,loc,identifier,TVar2);
  if (bVar1) {
    this_local = (TParseContext *)0x0;
  }
  else {
    if (type.spirvType == (TSpirvType *)0x0) {
      nonInitConstCheck(this,loc,identifier,(TType *)local_d8);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x43])
                (this,loc,"initializer",type.spirvType);
    }
    samplerCheck(this,loc,(TType *)local_d8,identifier,(TIntermTyped *)type.spirvType);
    transparentOpaqueCheck(this,loc,(TType *)local_d8,identifier);
    atomicUintCheck(this,loc,(TType *)local_d8,identifier);
    accStructCheck(this,loc,(TType *)local_d8,identifier);
    hitObjectNVCheck(this,loc,(TType *)local_d8,identifier);
    checkAndResizeMeshViewDim(this,loc,(TType *)local_d8,false);
    pTVar8 = TType::getQualifier((TType *)local_d8);
    if ((((uint)*(undefined8 *)&pTVar8->field_0x8 & 0x7f) == 2) &&
       (bVar1 = TType::containsReference((TType *)local_d8), bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"variables with reference type can\'t have qualifier \'const\'",
                 "qualifier","");
    }
    pTVar8 = TType::getQualifier((TType *)local_d8);
    if ((((uint)*(undefined8 *)&pTVar8->field_0x8 & 0x7f) != 5) &&
       (pTVar8 = TType::getQualifier((TType *)local_d8),
       ((uint)*(undefined8 *)&pTVar8->field_0x8 & 0x7f) != 6)) {
      bVar1 = TType::contains16BitFloat((TType *)local_d8);
      if (bVar1) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x15])
                  (this,loc,"qualifier");
      }
      bVar1 = TType::contains16BitInt((TType *)local_d8);
      if (bVar1) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x18])
                  (this,loc,"qualifier");
      }
      bVar1 = TType::contains8BitInt((TType *)local_d8);
      if (bVar1) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1b])
                  (this,loc,"qualifier");
      }
    }
    pTVar8 = TType::getQualifier((TType *)local_d8);
    if (((uint)*(undefined8 *)&pTVar8->field_0x8 & 0x7f) == 0xf) {
      TIntermediate::addTaskPayloadEXTCount
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    pTVar8 = TType::getQualifier((TType *)local_d8);
    if ((((uint)*(undefined8 *)&pTVar8->field_0x8 & 0x7f) == 7) &&
       (bVar1 = TType::containsCoopMat((TType *)local_d8), bVar1)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"qualifier","Cooperative matrix types must not be used in shared memory",
                 "");
    }
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      pTVar8 = TType::getQualifier((TType *)local_d8);
      bVar1 = TQualifier::isPipeInput(pTVar8);
      if ((bVar1) && (TVar2 = TType::getBasicType((TType *)local_d8), TVar2 == EbtStruct)) {
        pTVar8 = TType::getQualifier((TType *)local_d8);
        bVar1 = TQualifier::isArrayedIo
                          (pTVar8,(this->super_TParseContextBase).super_TParseVersions.language);
        if (bVar1) {
          TType::TType((TType *)&symbol,(TType *)local_d8,0,false);
          bVar1 = TType::containsArray((TType *)&symbol);
          if ((bVar1) && (bVar1 = TType::containsBuiltIn((TType *)&symbol), !bVar1)) {
            pTVar9 = TType::getTypeName_abi_cxx11_((TType *)local_d8);
            pcVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(pTVar9);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,
                       "A per vertex structure containing an array is not allowed as input in ES",
                       pcVar7,"");
          }
          TType::~TType((TType *)&symbol);
        }
        else {
          bVar1 = TType::containsArray((TType *)local_d8);
          if ((bVar1) && (bVar1 = TType::containsBuiltIn((TType *)local_d8), !bVar1)) {
            pTVar9 = TType::getTypeName_abi_cxx11_((TType *)local_d8);
            pcVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(pTVar9);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"A structure containing an array is not allowed as input in ES",
                       pcVar7,"");
          }
        }
        bVar1 = TType::containsStructure((TType *)local_d8);
        if (bVar1) {
          pTVar9 = TType::getTypeName_abi_cxx11_((TType *)local_d8);
          pcVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (pTVar9);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"A structure containing an struct is not allowed as input in ES",
                     pcVar7,"");
        }
      }
    }
    bVar1 = std::operator!=(identifier,"gl_FragCoord");
    if ((bVar1) &&
       ((((publicType->shaderQualifiers).originUpperLeft & 1U) != 0 ||
        (((publicType->shaderQualifiers).pixelCenterInteger & 1U) != 0)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply origin_upper_left and pixel_center_origin to gl_FragCoord"
                 ,"layout qualifier","");
    }
    bVar1 = std::operator!=(identifier,"gl_FragDepth");
    if ((bVar1) &&
       (TVar4 = TShaderQualifiers::getDepth(&publicType->shaderQualifiers), TVar4 != EldNone)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply depth layout to gl_FragDepth","layout qualifier","");
    }
    bVar1 = std::operator!=(identifier,"gl_FragStencilRefARB");
    if ((bVar1) &&
       (TVar5 = TShaderQualifiers::getStencil(&publicType->shaderQualifiers), TVar5 != ElsNone)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply depth layout to gl_FragStencilRefARB","layout qualifier",
                 "");
    }
    pTVar8 = TType::getQualifier((TType *)local_d8);
    pTStack_180 = (TVariable *)
                  redeclareBuiltinVariable(this,loc,identifier,pTVar8,&publicType->shaderQualifiers)
    ;
    if (pTStack_180 == (TVariable *)0x0) {
      reservedErrorCheck(this,loc,identifier);
    }
    if ((((pTStack_180 == (TVariable *)0x0) &&
         (0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan)) &&
        (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U) != 0))
       && (bVar1 = vkRelaxedRemapUniformVariable
                             (this,loc,identifier,publicType,arraySizes,
                              (TIntermTyped *)type.spirvType,(TType *)local_d8), bVar1)) {
      this_local = (TParseContext *)0x0;
    }
    else {
      pTVar8 = TType::getQualifier((TType *)local_d8);
      inheritGlobalDefaults(this,pTVar8);
      bVar1 = TType::isArray((TType *)local_d8);
      if (bVar1) {
        pTVar8 = TType::getQualifier((TType *)local_d8);
        pTVar6 = TType::getArraySizes((TType *)local_d8);
        arraySizesCheck(this,loc,pTVar8,pTVar6,(TIntermTyped *)type.spirvType,false);
        pTVar8 = TType::getQualifier((TType *)local_d8);
        bVar1 = arrayQualifierError(this,loc,pTVar8);
        if ((!bVar1) && (bVar1 = arrayError(this,loc,(TType *)local_d8), !bVar1)) {
          declareArray(this,loc,identifier,(TType *)local_d8,(TSymbol **)&stack0xfffffffffffffe80);
        }
        if (type.spirvType != (TSpirvType *)0x0) {
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,1,0x78,"GL_3DL_array_objects","initializer");
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,8,300,(char *)0x0,"initializer");
        }
      }
      else if (pTStack_180 == (TVariable *)0x0) {
        pTStack_180 = declareNonArray(this,loc,identifier,(TType *)local_d8);
      }
      else {
        iVar3 = (*(pTStack_180->super_TSymbol)._vptr_TSymbol[0xc])();
        bVar1 = TType::operator!=((TType *)local_d8,(TType *)CONCAT44(extraout_var,iVar3));
        if (bVar1) {
          iVar3 = (*(pTStack_180->super_TSymbol)._vptr_TSymbol[3])();
          pcVar7 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_00,iVar3));
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change the type of","redeclaration",pcVar7);
        }
      }
      if (pTStack_180 == (TVariable *)0x0) {
        this_local = (TParseContext *)0x0;
      }
      else {
        variable = (TVariable *)0x0;
        if ((pTStack_180 != (TVariable *)0x0) && (type.spirvType != (TSpirvType *)0x0)) {
          iVar3 = (*(pTStack_180->super_TSymbol)._vptr_TSymbol[9])();
          if ((TVariable *)CONCAT44(extraout_var_01,iVar3) == (TVariable *)0x0) {
            pcVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     c_str(identifier);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"initializer requires a variable, not a member",pcVar7,"");
            this_local = (TParseContext *)0x0;
            goto LAB_006a3411;
          }
          variable = (TVariable *)
                     executeInitializer(this,loc,(TIntermTyped *)type.spirvType,
                                        (TVariable *)CONCAT44(extraout_var_01,iVar3));
        }
        layoutObjectCheck(this,loc,&pTStack_180->super_TSymbol);
        fixOffset(this,loc,&pTStack_180->super_TSymbol);
        this_local = (TParseContext *)variable;
      }
    }
  }
LAB_006a3411:
  perVertexType.spirvType._4_4_ = 1;
  TType::~TType((TType *)local_d8);
  return (TIntermNode *)this_local;
}

Assistant:

TIntermNode* TParseContext::declareVariable(const TSourceLoc& loc, TString& identifier, const TPublicType& publicType,
    TArraySizes* arraySizes, TIntermTyped* initializer)
{
    // Make a fresh type that combines the characteristics from the individual
    // identifier syntax and the declaration-type syntax.
    TType type(publicType);
    type.transferArraySizes(arraySizes);
    type.copyArrayInnerSizes(publicType.arraySizes);
    arrayOfArrayVersionCheck(loc, type.getArraySizes());

    if (initializer) {
        if (type.getBasicType() == EbtRayQuery) {
            error(loc, "ray queries can only be initialized by using the rayQueryInitializeEXT intrinsic:", "=", identifier.c_str());
        } else if (type.getBasicType() == EbtHitObjectNV) {
            error(loc, "hit objects cannot be initialized using initializers", "=", identifier.c_str());
        }

    }

    if (type.isCoopMatKHR()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes ||
            publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "unexpected number type parameters", identifier.c_str(), "");
        }
        if (publicType.typeParameters) {
            if (!isTypeFloat(publicType.typeParameters->basicType) &&
                !isTypeInt(publicType.typeParameters->basicType) && publicType.typeParameters->basicType != EbtSpirvType) {
                error(loc, "expected 8, 16, 32, or 64 bit signed or unsigned integer or 16, 32, or 64 bit float type", identifier.c_str(), "");
            }
        }
    }
    else if (type.isCoopMatNV()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes || publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "expected four type parameters", identifier.c_str(), "");
        } else {
            if (isTypeFloat(publicType.basicType) &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 16 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 32 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 64) {
                error(loc, "expected 16, 32, or 64 bits for first type parameter", identifier.c_str(), "");
            }
            if (isTypeInt(publicType.basicType) &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 8 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 16 &&
                publicType.typeParameters->arraySizes->getDimSize(0) != 32) {
                error(loc, "expected 8, 16, or 32 bits for first type parameter", identifier.c_str(), "");
            }
        }
    } else if (type.isTensorLayoutNV()) {
        if (!publicType.typeParameters || publicType.typeParameters->arraySizes->getNumDims() > 2) {
            error(loc, "expected 1-2 type parameters", identifier.c_str(), "");
        }
    } else if (type.isTensorViewNV()) {
        if (!publicType.typeParameters || publicType.typeParameters->arraySizes->getNumDims() > 7) {
            error(loc, "expected 1-7 type parameters", identifier.c_str(), "");
        }
    } else if (type.isCoopVecNV()) {
        intermediate.setUseVulkanMemoryModel();
        intermediate.setUseStorageBuffer();

        if (!publicType.typeParameters || !publicType.typeParameters->arraySizes || publicType.typeParameters->arraySizes->getNumDims() != 1) {
            error(loc, "expected two type parameters", identifier.c_str(), "");
        } else if (publicType.typeParameters->arraySizes->getDimSize(0) <= 0) {
            error(loc, "expected positive number of components", identifier.c_str(), "");
        }
    } else {
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() != 0) {
            error(loc, "unexpected type parameters", identifier.c_str(), "");
        }
    }

    if (voidErrorCheck(loc, identifier, type.getBasicType()))
        return nullptr;

    if (initializer)
        rValueErrorCheck(loc, "initializer", initializer);
    else
        nonInitConstCheck(loc, identifier, type);

    samplerCheck(loc, type, identifier, initializer);
    transparentOpaqueCheck(loc, type, identifier);
    atomicUintCheck(loc, type, identifier);
    accStructCheck(loc, type, identifier);
    hitObjectNVCheck(loc, type, identifier);
    checkAndResizeMeshViewDim(loc, type, /*isBlockMember*/ false);
    if (type.getQualifier().storage == EvqConst && type.containsReference()) {
        error(loc, "variables with reference type can't have qualifier 'const'", "qualifier", "");
    }

    if (type.getQualifier().storage != EvqUniform && type.getQualifier().storage != EvqBuffer) {
        if (type.contains16BitFloat())
            requireFloat16Arithmetic(loc, "qualifier", "float16 types can only be in uniform block or buffer storage");
        if (type.contains16BitInt())
            requireInt16Arithmetic(loc, "qualifier", "(u)int16 types can only be in uniform block or buffer storage");
        if (type.contains8BitInt())
            requireInt8Arithmetic(loc, "qualifier", "(u)int8 types can only be in uniform block or buffer storage");
    }

    if (type.getQualifier().storage == EvqtaskPayloadSharedEXT)
        intermediate.addTaskPayloadEXTCount();
    if (type.getQualifier().storage == EvqShared && type.containsCoopMat())
        error(loc, "qualifier", "Cooperative matrix types must not be used in shared memory", "");

    if (profile == EEsProfile) {
        if (type.getQualifier().isPipeInput() && type.getBasicType() == EbtStruct) {
            if (type.getQualifier().isArrayedIo(language)) {
                TType perVertexType(type, 0);
                if (perVertexType.containsArray() && perVertexType.containsBuiltIn() == false) {
                    error(loc, "A per vertex structure containing an array is not allowed as input in ES", type.getTypeName().c_str(), "");
                }
            }
            else if (type.containsArray() && type.containsBuiltIn() == false) {
                error(loc, "A structure containing an array is not allowed as input in ES", type.getTypeName().c_str(), "");
            }
            if (type.containsStructure())
                error(loc, "A structure containing an struct is not allowed as input in ES", type.getTypeName().c_str(), "");
        }
    }

    if (identifier != "gl_FragCoord" && (publicType.shaderQualifiers.originUpperLeft || publicType.shaderQualifiers.pixelCenterInteger))
        error(loc, "can only apply origin_upper_left and pixel_center_origin to gl_FragCoord", "layout qualifier", "");
    if (identifier != "gl_FragDepth" && publicType.shaderQualifiers.getDepth() != EldNone)
        error(loc, "can only apply depth layout to gl_FragDepth", "layout qualifier", "");
    if (identifier != "gl_FragStencilRefARB" && publicType.shaderQualifiers.getStencil() != ElsNone)
        error(loc, "can only apply depth layout to gl_FragStencilRefARB", "layout qualifier", "");

    // Check for redeclaration of built-ins and/or attempting to declare a reserved name
    TSymbol* symbol = redeclareBuiltinVariable(loc, identifier, type.getQualifier(), publicType.shaderQualifiers);
    if (symbol == nullptr)
        reservedErrorCheck(loc, identifier);

    if (symbol == nullptr && spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed) {
        bool remapped = vkRelaxedRemapUniformVariable(loc, identifier, publicType, arraySizes, initializer, type);

        if (remapped) {
            return nullptr;
        }
    }

    inheritGlobalDefaults(type.getQualifier());

    // Declare the variable
    if (type.isArray()) {
        // Check that implicit sizing is only where allowed.
        arraySizesCheck(loc, type.getQualifier(), type.getArraySizes(), initializer, false);

        if (! arrayQualifierError(loc, type.getQualifier()) && ! arrayError(loc, type))
            declareArray(loc, identifier, type, symbol);

        if (initializer) {
            profileRequires(loc, ENoProfile, 120, E_GL_3DL_array_objects, "initializer");
            profileRequires(loc, EEsProfile, 300, nullptr, "initializer");
        }
    } else {
        // non-array case
        if (symbol == nullptr)
            symbol = declareNonArray(loc, identifier, type);
        else if (type != symbol->getType())
            error(loc, "cannot change the type of", "redeclaration", symbol->getName().c_str());
    }

    if (symbol == nullptr)
        return nullptr;

    // Deal with initializer
    TIntermNode* initNode = nullptr;
    if (symbol != nullptr && initializer) {
        TVariable* variable = symbol->getAsVariable();
        if (! variable) {
            error(loc, "initializer requires a variable, not a member", identifier.c_str(), "");
            return nullptr;
        }
        initNode = executeInitializer(loc, initializer, variable);
    }

    // look for errors in layout qualifier use
    layoutObjectCheck(loc, *symbol);

    // fix up
    fixOffset(loc, *symbol);

    return initNode;
}